

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

char  [7] kj::_::operator*(String *param_1,undefined8 *param_2,undefined8 param_3,undefined8 param_4
                          ,ArrayPtr<const_char> *param_5)

{
  ArrayPtr<const_char> *params;
  ArrayPtr<const_char> local_40;
  ArrayPtr<const_char> local_30;
  undefined8 *local_20;
  DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *cmp_local;
  String *local_10;
  
  local_20 = param_2;
  local_10 = param_1;
  local_30 = tryToCharSequence<kj::StringPtr,kj::ArrayPtr<char_const>>((StringPtr *)*param_2);
  params = (ArrayPtr<const_char> *)(local_20 + 2);
  local_40 = tryToCharSequence<char_const[7],kj::ArrayPtr<char_const>>((char (*) [7])local_20[1]);
  concat<kj::ArrayPtr<char_const>,kj::StringPtr&,kj::ArrayPtr<char_const>>
            (param_1,(_ *)&local_30,params,(StringPtr *)&local_40,param_5);
  return SUB87(param_1,0);
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}